

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

int lua_resetthread(lua_State *L)

{
  int iVar1;
  int local_1c;
  int status;
  CallInfo *ci;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x148,"int lua_resetthread(lua_State *)");
  }
  L->ci = &L->base_ci;
  L->stack->tt_ = 0;
  (L->base_ci).func = L->stack;
  (L->base_ci).callstatus = 0;
  local_1c = luaF_close(L,L->stack,-2);
  if (local_1c == -2) {
    local_1c = 0;
    L->top = L->stack + 1;
  }
  else {
    luaD_seterrorobj(L,local_1c,L->stack + 1);
  }
  (L->base_ci).top = L->top + 0x14;
  L->status = (lu_byte)local_1c;
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    return local_1c;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x156,"int lua_resetthread(lua_State *)");
}

Assistant:

int lua_resetthread (lua_State *L) {
  CallInfo *ci;
  int status;
  lua_lock(L);
  L->ci = ci = &L->base_ci;  /* unwind CallInfo list */
  setnilvalue(L->stack);  /* 'function' entry for basic 'ci' */
  ci->func = L->stack;
  ci->callstatus = 0;
  status = luaF_close(L, L->stack, CLOSEPROTECT);
  if (status != CLOSEPROTECT)  /* real errors? */
    luaD_seterrorobj(L, status, L->stack + 1);
  else {
    status = LUA_OK;
    L->top = L->stack + 1;
  }
  ci->top = L->top + LUA_MINSTACK;
  L->status = status;
  lua_unlock(L);
  return status;
}